

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::DecimalFormat::getPadCharacterString
          (UnicodeString *__return_storage_ptr__,DecimalFormat *this)

{
  UBool UVar1;
  DecimalFormatProperties *pDVar2;
  ConstChar16Ptr local_20;
  DecimalFormat *local_18;
  DecimalFormat *this_local;
  
  local_18 = this;
  this_local = (DecimalFormat *)__return_storage_ptr__;
  pDVar2 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                     ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                      this->fields);
  UVar1 = UnicodeString::isBogus(&pDVar2->padString);
  if (UVar1 == '\0') {
    pDVar2 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                        this->fields);
    UnicodeString::UnicodeString(__return_storage_ptr__,&pDVar2->padString);
  }
  else {
    ConstChar16Ptr::ConstChar16Ptr(&local_20,L" ");
    UnicodeString::UnicodeString(__return_storage_ptr__,'\x01',&local_20,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString DecimalFormat::getPadCharacterString() const {
    if (fields->properties->padString.isBogus()) {
        // Readonly-alias the static string kFallbackPaddingString
        return {TRUE, kFallbackPaddingString, -1};
    } else {
        return fields->properties->padString;
    }
}